

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

void check_leaf_list_backlinks(lyd_node *node,int op)

{
  lys_node *plVar1;
  lys_node *plVar2;
  ly_set *__ptr;
  ulong uVar3;
  lyd_node *plVar4;
  LY_ERR *pLVar5;
  lyd_node *plVar6;
  ulong uVar7;
  
  if (2 < (uint)op) {
    __assert_fail("(op == 0) || (op == 1) || (op == 2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                  ,0x2ff,"void check_leaf_list_backlinks(struct lyd_node *, int)");
  }
  plVar6 = node;
  if (node != (lyd_node *)0x0) {
    do {
      if ((((plVar6->schema->nodetype & (LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) &&
          (plVar1 = plVar6->schema->child, plVar1 != (lys_node *)0x0)) &&
         (*(int *)((long)&plVar1->name + 4) != 0)) {
        uVar7 = 0;
        do {
          __ptr = lyd_find_instance(plVar6,*(lys_node **)(plVar1->dsc + uVar7 * 8));
          if (__ptr == (ly_set *)0x0) {
            pLVar5 = ly_errno_location();
            *pLVar5 = LY_EINT;
            ly_log(LY_LLERR,"Internal error (%s:%d).",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                   ,0x317);
            return;
          }
          if (__ptr->number != 0) {
            uVar3 = 0;
            do {
              plVar2 = (__ptr->set).s[uVar3];
              if (op == 0) {
LAB_0015d10d:
                if (((ulong)plVar2->parent & 0x40) != 0) {
LAB_0015d113:
                  *(byte *)&plVar2->dsc = *(byte *)&plVar2->dsc | 4;
                  if (*(short *)&plVar2->parent == 9) {
                    *(undefined8 *)&plVar2->nodetype = 0;
                  }
                }
              }
              else {
                if ((*(short *)&plVar2->parent == 9) && (*(lyd_node **)&plVar2->nodetype == plVar6))
                goto LAB_0015d113;
                if (op != 1) goto LAB_0015d10d;
              }
              uVar3 = uVar3 + 1;
            } while (uVar3 < __ptr->number);
          }
          free((__ptr->set).s);
          free(__ptr);
          uVar7 = uVar7 + 1;
        } while (uVar7 < *(uint *)((long)&plVar1->name + 4));
      }
      if ((plVar6->schema->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
        plVar4 = plVar6->child;
      }
      else {
        plVar4 = (lyd_node *)0x0;
      }
      if (plVar4 == (lyd_node *)0x0) {
        if (plVar6 == node) break;
        plVar4 = plVar6->next;
      }
      if (plVar4 == (lyd_node *)0x0) {
        for (plVar6 = plVar6->parent;
            (plVar6->parent != node->parent && (plVar4 = plVar6->next, plVar4 == (lyd_node *)0x0));
            plVar6 = plVar6->parent) {
        }
      }
      plVar6 = plVar4;
    } while (plVar4 != (lyd_node *)0x0);
  }
  if (node->parent != (lyd_node *)0x0) {
    node->parent->validity = '\x02';
  }
  lyd_wd_update_parents(node);
  return;
}

Assistant:

static void
check_leaf_list_backlinks(struct lyd_node *node, int op)
{
    struct lyd_node *next, *iter;
    struct lyd_node_leaf_list *leaf_list;
    struct ly_set *set, *data;
    uint32_t i, j;

    assert((op == 0) || (op == 1) || (op == 2));

    /* fix leafrefs */
    LY_TREE_DFS_BEGIN(node, next, iter) {
        /* the node is target of a leafref */
        if ((iter->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST)) && iter->schema->child) {
            set = (struct ly_set *)iter->schema->child;
            for (i = 0; i < set->number; i++) {
                data = lyd_find_instance(iter, set->set.s[i]);
                if (data) {
                    for (j = 0; j < data->number; j++) {
                        leaf_list = (struct lyd_node_leaf_list *)data->set.d[j];
                        if (((op != 0) && (leaf_list->value_type == LY_TYPE_LEAFREF) && (leaf_list->value.leafref == iter))
                                || ((op != 1) && (leaf_list->value_type & LY_TYPE_LEAFREF_UNRES))) {
                            /* invalidate the leafref, a change concerning it happened */
                            leaf_list->validity |= LYD_VAL_LEAFREF;
                            if (leaf_list->value_type == LY_TYPE_LEAFREF) {
                                /* remove invalid link */
                                leaf_list->value.leafref = NULL;
                            }
                        }
                    }
                    ly_set_free(data);
                } else {
                    LOGINT;
                    return;
                }
            }
        }
        LY_TREE_DFS_END(node, next, iter)
    }

    /* invalidate parent to make sure it will be checked in future validation */
    if (node->parent) {
        node->parent->validity = LYD_VAL_MAND;
    }

    /* update parent's default flag if needed */
    lyd_wd_update_parents(node);
}